

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Bias_x86_avx::forward_inplace(Bias_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Mat local_78;
  
  iVar14 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  lVar2 = *(long *)(&this->field_0xd8 + (long)this->_vptr_Bias_x86_avx[-3]);
  uVar16 = 0;
  uVar15 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar15 = uVar16;
  }
  for (; uVar16 != uVar15; uVar16 = uVar16 + 1) {
    ncnn::Mat::channel(&local_78,bottom_top_blob,(int)uVar16);
    pvVar10 = local_78.data;
    ncnn::Mat::~Mat(&local_78);
    fVar1 = *(float *)(lVar2 + uVar16 * 4);
    auVar17._4_4_ = fVar1;
    auVar17._0_4_ = fVar1;
    auVar17._8_4_ = fVar1;
    auVar17._12_4_ = fVar1;
    lVar11 = 0;
    pauVar13 = (undefined1 (*) [16])pvVar10;
    for (iVar12 = 0; iVar12 + 7 < iVar14; iVar12 = iVar12 + 8) {
      fVar3 = *(float *)(*pauVar13 + 4);
      fVar4 = *(float *)(*pauVar13 + 8);
      fVar5 = *(float *)(*pauVar13 + 0xc);
      fVar6 = *(float *)pauVar13[1];
      fVar7 = *(float *)(pauVar13[1] + 4);
      fVar8 = *(float *)(pauVar13[1] + 8);
      fVar9 = *(float *)(pauVar13[1] + 0xc);
      *(float *)*pauVar13 = fVar1 + *(float *)*pauVar13;
      *(float *)(*pauVar13 + 4) = fVar1 + fVar3;
      *(float *)(*pauVar13 + 8) = fVar1 + fVar4;
      *(float *)(*pauVar13 + 0xc) = fVar1 + fVar5;
      *(float *)pauVar13[1] = fVar1 + fVar6;
      *(float *)(pauVar13[1] + 4) = fVar1 + fVar7;
      *(float *)(pauVar13[1] + 8) = fVar1 + fVar8;
      *(float *)(pauVar13[1] + 0xc) = fVar1 + fVar9;
      pauVar13 = pauVar13 + 2;
      lVar11 = lVar11 + 8;
    }
    auVar17 = vshufps_avx(auVar17,auVar17,0);
    for (; iVar12 + 3 < iVar14; iVar12 = iVar12 + 4) {
      auVar18._0_4_ = auVar17._0_4_ + *(float *)*pauVar13;
      auVar18._4_4_ = auVar17._4_4_ + *(float *)(*pauVar13 + 4);
      auVar18._8_4_ = auVar17._8_4_ + *(float *)(*pauVar13 + 8);
      auVar18._12_4_ = auVar17._12_4_ + *(float *)(*pauVar13 + 0xc);
      *pauVar13 = auVar18;
      pauVar13 = pauVar13 + 1;
      lVar11 = lVar11 + 4;
    }
    for (; (int)lVar11 < iVar14; lVar11 = lVar11 + 1) {
      *(float *)((undefined1 *)pvVar10 + lVar11 * 4) =
           fVar1 + *(float *)((undefined1 *)pvVar10 + lVar11 * 4);
    }
  }
  return 0;
}

Assistant:

int Bias_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}